

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSource.cpp
# Opt level: O0

double __thiscall csv::icu::FileDataSource::progress(FileDataSource *this)

{
  long lVar1;
  double *pdVar2;
  double local_38;
  double local_30;
  double local_28;
  double len;
  double pos;
  FILE *internal_file;
  FileDataSource *this_local;
  
  internal_file = (FILE *)this;
  pos = (double)u_fgetfile_70(this->_in);
  lVar1 = ftell((FILE *)pos);
  len = (double)lVar1;
  local_28 = (double)this->_length;
  local_30 = len / local_28;
  local_38 = 1.0;
  pdVar2 = std::min<double>(&local_30,&local_38);
  return *pdVar2;
}

Assistant:

double FileDataSource::progress() {
		// ICU appears to perform buffering from the underlying file handle in order to optimize reading
		// As such this method is not byte-accurate as it will depend on how much data ICU buffers during reading
		// So, for small files the progress will always be 1.0, however for larger files it will chunk.
		FILE* internal_file = u_fgetfile(_in);
		double pos = ftell(internal_file);
		double len = _length;
		return std::min(pos / len, 1.0);
	}